

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall
QGraphicsView::ensureVisible(QGraphicsView *this,QRectF *rect,int xmargin,int ymargin)

{
  int iVar1;
  int iVar2;
  QGraphicsViewPrivate *this_00;
  long lVar3;
  QWidget *pQVar4;
  QScrollBar *pQVar5;
  qint64 qVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  double dVar9;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  dVar9 = (double)(((pQVar4->data->crect).x2.m_i - (pQVar4->data->crect).x1.m_i) + 1);
  pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar1 = (pQVar4->data->crect).y2.m_i;
  iVar2 = (pQVar4->data->crect).y1.m_i;
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QTransform::mapRect(&local_58);
  if ((this_00->field_0x300 & 0x20) == 0) {
    qVar6 = this_00->scrollX;
  }
  else {
    QGraphicsViewPrivate::updateScroll(this_00);
    qVar6 = this_00->scrollX;
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
  }
  lVar3 = this_00->scrollY;
  dVar8 = (double)xmargin;
  if ((((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) <= dVar8 + (double)qVar6) &&
      (this_00->leftIndent == 0.0)) && (!NAN(this_00->leftIndent))) {
    pQVar5 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar5->super_QAbstractSlider,
               (int)(((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) - dVar8) + -0.5));
  }
  dVar7 = (double)((iVar1 - iVar2) + 1);
  if (((((double)qVar6 + dVar9) - dVar8 <=
        (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
        (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) && (this_00->leftIndent == 0.0)) &&
     (!NAN(this_00->leftIndent))) {
    pQVar5 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar5->super_QAbstractSlider,
               (int)((((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
                      (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) - dVar9) + dVar8 + 0.5));
  }
  dVar9 = (double)ymargin;
  if ((((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) <= (double)lVar3 + dVar9) &&
      (this_00->topIndent == 0.0)) && (!NAN(this_00->topIndent))) {
    pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar5->super_QAbstractSlider,
               (int)(((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) - dVar9) + -0.5));
  }
  if ((((dVar7 + (double)lVar3) - dVar9 <=
        (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) +
        (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_)) && (this_00->topIndent == 0.0)) &&
     (!NAN(this_00->topIndent))) {
    pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar5->super_QAbstractSlider,
               (int)((((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) +
                      (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_)) - dVar7) + dVar9 + 0.5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    Q_D(QGraphicsView);
    qreal width = viewport()->width();
    qreal height = viewport()->height();
    QRectF viewRect = d->matrix.mapRect(rect);

    qreal left = d->horizontalScroll();
    qreal right = left + width;
    qreal top = d->verticalScroll();
    qreal bottom = top + height;

    if (viewRect.left() <= left + xmargin) {
        // need to scroll from the left
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.left() - xmargin - 0.5));
    }
    if (viewRect.right() >= right - xmargin) {
        // need to scroll from the right
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.right() - width + xmargin + 0.5));
    }
    if (viewRect.top() <= top + ymargin) {
        // need to scroll from the top
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.top() - ymargin - 0.5));
    }
    if (viewRect.bottom() >= bottom - ymargin) {
        // need to scroll from the bottom
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.bottom() - height + ymargin + 0.5));
    }
}